

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NonMaximumSuppression.pb.cc
# Opt level: O3

size_t __thiscall
CoreML::Specification::NonMaximumSuppression::ByteSizeLong(NonMaximumSuppression *this)

{
  long lVar1;
  NonMaximumSuppression_PickTop *pNVar2;
  ulong uVar3;
  int iVar4;
  size_t sVar5;
  size_t sVar6;
  ulong uVar7;
  uint uVar8;
  
  lVar1 = *(long *)(((ulong)(this->confidenceinputfeaturename_).tagged_ptr_.ptr_ &
                    0xfffffffffffffffe) + 8);
  if (lVar1 == 0) {
    sVar5 = 0;
  }
  else {
    uVar8 = (uint)lVar1 | 1;
    iVar4 = 0x1f;
    if (uVar8 != 0) {
      for (; uVar8 >> iVar4 == 0; iVar4 = iVar4 + -1) {
      }
    }
    sVar5 = lVar1 + (ulong)(iVar4 * 9 + 0x49U >> 6) + 2;
  }
  lVar1 = *(long *)(((ulong)(this->coordinatesinputfeaturename_).tagged_ptr_.ptr_ &
                    0xfffffffffffffffe) + 8);
  if (lVar1 != 0) {
    uVar8 = (uint)lVar1 | 1;
    iVar4 = 0x1f;
    if (uVar8 != 0) {
      for (; uVar8 >> iVar4 == 0; iVar4 = iVar4 + -1) {
      }
    }
    sVar5 = sVar5 + lVar1 + (ulong)(iVar4 * 9 + 0x49U >> 6) + 2;
  }
  lVar1 = *(long *)(((ulong)(this->iouthresholdinputfeaturename_).tagged_ptr_.ptr_ &
                    0xfffffffffffffffe) + 8);
  if (lVar1 != 0) {
    uVar8 = (uint)lVar1 | 1;
    iVar4 = 0x1f;
    if (uVar8 != 0) {
      for (; uVar8 >> iVar4 == 0; iVar4 = iVar4 + -1) {
      }
    }
    sVar5 = sVar5 + lVar1 + (ulong)(iVar4 * 9 + 0x49U >> 6) + 2;
  }
  lVar1 = *(long *)(((ulong)(this->confidencethresholdinputfeaturename_).tagged_ptr_.ptr_ &
                    0xfffffffffffffffe) + 8);
  if (lVar1 != 0) {
    uVar8 = (uint)lVar1 | 1;
    iVar4 = 0x1f;
    if (uVar8 != 0) {
      for (; uVar8 >> iVar4 == 0; iVar4 = iVar4 + -1) {
      }
    }
    sVar5 = sVar5 + lVar1 + (ulong)(iVar4 * 9 + 0x49U >> 6) + 2;
  }
  lVar1 = *(long *)(((ulong)(this->confidenceoutputfeaturename_).tagged_ptr_.ptr_ &
                    0xfffffffffffffffe) + 8);
  if (lVar1 != 0) {
    uVar8 = (uint)lVar1 | 1;
    iVar4 = 0x1f;
    if (uVar8 != 0) {
      for (; uVar8 >> iVar4 == 0; iVar4 = iVar4 + -1) {
      }
    }
    sVar5 = sVar5 + lVar1 + (ulong)(iVar4 * 9 + 0x49U >> 6) + 2;
  }
  lVar1 = *(long *)(((ulong)(this->coordinatesoutputfeaturename_).tagged_ptr_.ptr_ &
                    0xfffffffffffffffe) + 8);
  if (lVar1 != 0) {
    uVar8 = (uint)lVar1 | 1;
    iVar4 = 0x1f;
    if (uVar8 != 0) {
      for (; uVar8 >> iVar4 == 0; iVar4 = iVar4 + -1) {
      }
    }
    sVar5 = sVar5 + lVar1 + (ulong)(iVar4 * 9 + 0x49U >> 6) + 2;
  }
  sVar6 = sVar5 + 10;
  if (this->iouthreshold_ == 0.0) {
    sVar6 = sVar5;
  }
  sVar5 = sVar6 + 10;
  if (this->confidencethreshold_ == 0.0) {
    sVar5 = sVar6;
  }
  if (this->_oneof_case_[0] == 1) {
    pNVar2 = (this->SuppressionMethod_).picktop_;
    uVar7 = (ulong)((uint)pNVar2->perclass_ * 2);
    uVar3 = (pNVar2->super_MessageLite)._internal_metadata_.ptr_;
    if ((uVar3 & 1) != 0) {
      uVar7 = uVar7 + *(long *)((uVar3 & 0xfffffffffffffffc) + 0x10);
    }
    (pNVar2->_cached_size_).size_.super___atomic_base<int>._M_i = (uint)uVar7;
    uVar8 = (uint)uVar7 | 1;
    iVar4 = 0x1f;
    if (uVar8 != 0) {
      for (; uVar8 >> iVar4 == 0; iVar4 = iVar4 + -1) {
      }
    }
    sVar5 = sVar5 + uVar7 + (ulong)(iVar4 * 9 + 0x49U >> 6) + 1;
  }
  if (this->_oneof_case_[1] == 0x65) {
    sVar6 = Int64Vector::ByteSizeLong((this->ClassLabels_).int64classlabels_);
  }
  else {
    if (this->_oneof_case_[1] != 100) goto LAB_002b842c;
    sVar6 = StringVector::ByteSizeLong((this->ClassLabels_).stringclasslabels_);
  }
  uVar8 = (uint)sVar6 | 1;
  iVar4 = 0x1f;
  if (uVar8 != 0) {
    for (; uVar8 >> iVar4 == 0; iVar4 = iVar4 + -1) {
    }
  }
  sVar5 = sVar5 + sVar6 + (ulong)(iVar4 * 9 + 0x49U >> 6) + 2;
LAB_002b842c:
  uVar3 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar3 & 1) != 0) {
    sVar5 = sVar5 + *(long *)((uVar3 & 0xfffffffffffffffc) + 0x10);
  }
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = (__int_type)sVar5;
  return sVar5;
}

Assistant:

size_t NonMaximumSuppression::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.NonMaximumSuppression)
  size_t total_size = 0;

  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  // string confidenceInputFeatureName = 200;
  if (!this->_internal_confidenceinputfeaturename().empty()) {
    total_size += 2 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
        this->_internal_confidenceinputfeaturename());
  }

  // string coordinatesInputFeatureName = 201;
  if (!this->_internal_coordinatesinputfeaturename().empty()) {
    total_size += 2 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
        this->_internal_coordinatesinputfeaturename());
  }

  // string iouThresholdInputFeatureName = 202;
  if (!this->_internal_iouthresholdinputfeaturename().empty()) {
    total_size += 2 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
        this->_internal_iouthresholdinputfeaturename());
  }

  // string confidenceThresholdInputFeatureName = 203;
  if (!this->_internal_confidencethresholdinputfeaturename().empty()) {
    total_size += 2 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
        this->_internal_confidencethresholdinputfeaturename());
  }

  // string confidenceOutputFeatureName = 210;
  if (!this->_internal_confidenceoutputfeaturename().empty()) {
    total_size += 2 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
        this->_internal_confidenceoutputfeaturename());
  }

  // string coordinatesOutputFeatureName = 211;
  if (!this->_internal_coordinatesoutputfeaturename().empty()) {
    total_size += 2 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
        this->_internal_coordinatesoutputfeaturename());
  }

  // double iouThreshold = 110;
  static_assert(sizeof(uint64_t) == sizeof(double), "Code assumes uint64_t and double are the same size.");
  double tmp_iouthreshold = this->_internal_iouthreshold();
  uint64_t raw_iouthreshold;
  memcpy(&raw_iouthreshold, &tmp_iouthreshold, sizeof(tmp_iouthreshold));
  if (raw_iouthreshold != 0) {
    total_size += 2 + 8;
  }

  // double confidenceThreshold = 111;
  static_assert(sizeof(uint64_t) == sizeof(double), "Code assumes uint64_t and double are the same size.");
  double tmp_confidencethreshold = this->_internal_confidencethreshold();
  uint64_t raw_confidencethreshold;
  memcpy(&raw_confidencethreshold, &tmp_confidencethreshold, sizeof(tmp_confidencethreshold));
  if (raw_confidencethreshold != 0) {
    total_size += 2 + 8;
  }

  switch (SuppressionMethod_case()) {
    // .CoreML.Specification.NonMaximumSuppression.PickTop pickTop = 1;
    case kPickTop: {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(
          *SuppressionMethod_.picktop_);
      break;
    }
    case SUPPRESSIONMETHOD_NOT_SET: {
      break;
    }
  }
  switch (ClassLabels_case()) {
    // .CoreML.Specification.StringVector stringClassLabels = 100;
    case kStringClassLabels: {
      total_size += 2 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(
          *ClassLabels_.stringclasslabels_);
      break;
    }
    // .CoreML.Specification.Int64Vector int64ClassLabels = 101;
    case kInt64ClassLabels: {
      total_size += 2 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::MessageSize(
          *ClassLabels_.int64classlabels_);
      break;
    }
    case CLASSLABELS_NOT_SET: {
      break;
    }
  }
  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    total_size += _internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size();
  }
  int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(total_size);
  SetCachedSize(cached_size);
  return total_size;
}